

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ScopedMessage::~ScopedMessage(ScopedMessage *this)

{
  IResultCapture *pIVar1;
  
  pIVar1 = getResultCapture();
  (*pIVar1->_vptr_IResultCapture[7])(pIVar1,this);
  MessageInfo::~MessageInfo(&this->m_info);
  return;
}

Assistant:

ScopedMessage::~ScopedMessage() {
        getResultCapture().popScopedMessage( m_info );
    }